

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnMemoryInit(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  char *pcVar4;
  int __c;
  Var *__s;
  Var VStack_b8;
  Var local_70;
  
  __s = &VStack_b8;
  this->expr_loc_ = loc;
  Var::Var(&local_70,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_70,(MemoryType *)0x0);
  Var::~Var(&local_70);
  Var::Var(&VStack_b8,segment_var);
  RVar2 = CheckDataSegmentIndex(this,&VStack_b8);
  Var::~Var(&VStack_b8);
  pcVar4 = Var::index(segment_var,(char *)__s,__c);
  RVar3 = TypeChecker::OnMemoryInit(&this->typechecker_,(uint32_t)pcVar4);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index());
  return result;
}